

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void __thiscall
FFT::FFTExecutor::directTransform(FFTExecutor *this,ComplexData *in,ComplexData *out)

{
  bool bVar1;
  undefined8 uVar2;
  BaseComplexData<kiss_fft_cpx> *in_RDX;
  imageException *in_RSI;
  FFTExecutor *in_RDI;
  ComplexData *in_stack_ffffffffffffffc8;
  kiss_fft_cpx *in_stack_ffffffffffffffd8;
  kiss_fftnd_cfg in_stack_ffffffffffffffe0;
  
  if (((in_RDI->_planDirect != (kiss_fftnd_cfg)0x0) &&
      (bVar1 = equalSize<FFT::FFTExecutor,FFT::ComplexData>(in_RDI,in_stack_ffffffffffffffc8), bVar1
      )) && (bVar1 = equalSize<FFT::ComplexData,FFT::ComplexData>
                               ((ComplexData *)in_RDI,in_stack_ffffffffffffffc8), bVar1)) {
    BaseComplexData<kiss_fft_cpx>::data((BaseComplexData<kiss_fft_cpx> *)in_RSI);
    BaseComplexData<kiss_fft_cpx>::data(in_RDX);
    kiss_fftnd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(kiss_fft_cpx *)in_RDI);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_RSI,(char *)in_RDX);
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FFTExecutor::directTransform( const ComplexData & in, ComplexData & out )
    {
        if ( _planDirect == 0 || !equalSize( *this, in ) || !equalSize( in, out ) )
            throw imageException( "Invalid parameters for FFTExecutor::directTransform()" );

        kiss_fftnd( _planDirect, in.data(), out.data() );
    }